

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::ShardedLRUCache(ShardedLRUCache *this,size_t capacity)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int s;
  size_t per_shard;
  LRUCache *in_stack_ffffffffffffff78;
  LRUCache *in_stack_ffffffffffffff88;
  undefined8 *local_40;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Cache::Cache((Cache *)in_stack_ffffffffffffff78);
  *in_RDI = &PTR__ShardedLRUCache_023cb198;
  local_40 = in_RDI + 2;
  do {
    LRUCache::LRUCache(in_stack_ffffffffffffff88);
    local_40 = local_40 + 0x1b;
  } while (local_40 != in_RDI + 0x1b2);
  port::Mutex::Mutex((Mutex *)in_stack_ffffffffffffff78);
  in_RDI[0x1b7] = 0;
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
    LRUCache::SetCapacity(in_stack_ffffffffffffff78,0x18c79e2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit ShardedLRUCache(size_t capacity) : last_id_(0) {
    const size_t per_shard = (capacity + (kNumShards - 1)) / kNumShards;
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].SetCapacity(per_shard);
    }
  }